

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall
Json::Value::setComment(Value *this,char *comment,size_t len,CommentPlacement placement)

{
  undefined8 *puVar1;
  CommentInfo *local_48;
  size_t sStack_20;
  CommentPlacement placement_local;
  size_t len_local;
  char *comment_local;
  Value *this_local;
  
  if (this->comments_ == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    local_48 = (CommentInfo *)(puVar1 + 1);
    do {
      CommentInfo::CommentInfo(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != (CommentInfo *)(puVar1 + 4));
    this->comments_ = (CommentInfo *)(puVar1 + 1);
  }
  sStack_20 = len;
  if ((len != 0) && (comment[len - 1] == '\n')) {
    sStack_20 = len - 1;
  }
  CommentInfo::setComment(this->comments_ + placement,comment,sStack_20);
  return;
}

Assistant:

void Value::setComment(const char* comment, size_t len, CommentPlacement placement) {
  if (!comments_)
    comments_ = new CommentInfo[numberOfCommentPlacement];
  if ((len > 0) && (comment[len-1] == '\n')) {
    // Always discard trailing newline, to aid indentation.
    len -= 1;
  }
  comments_[placement].setComment(comment, len);
}